

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar_p.h
# Opt level: O0

void __thiscall QTabBarPrivate::Tab::startAnimation(Tab *this,QTabBarPrivate *priv,int duration)

{
  bool bVar1;
  pointer pTVar2;
  undefined4 in_EDX;
  QTabBarPrivate *in_RSI;
  QTabBarPrivate **in_RDI;
  long in_FS_OFFSET;
  unique_ptr<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
  *in_stack_ffffffffffffff68;
  QTabBarPrivate *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff88;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isAnimated(in_stack_ffffffffffffff70);
  if (bVar1) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
                        *)0x6b6532);
    if (!bVar1) {
      std::make_unique<QTabBarPrivate::Tab::TabBarAnimation,QTabBarPrivate::Tab*,QTabBarPrivate*&>
                ((Tab **)CONCAT44(in_EDX,in_stack_ffffffffffffff88),in_RDI);
      std::
      unique_ptr<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
      ::operator=((unique_ptr<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
                   *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      std::
      unique_ptr<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
      ::~unique_ptr((unique_ptr<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
                     *)in_stack_ffffffffffffff70);
    }
    pTVar2 = std::
             unique_ptr<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
             ::operator->((unique_ptr<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
                           *)0x6b6585);
    ::QVariant::QVariant(&local_28,*(int *)(in_RDI + 0x1c));
    QVariantAnimation::setStartValue((QVariant *)pTVar2);
    ::QVariant::~QVariant(&local_28);
    pTVar2 = std::
             unique_ptr<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
             ::operator->((unique_ptr<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
                           *)0x6b65ca);
    ::QVariant::QVariant(&local_48,0);
    QVariantAnimation::setEndValue((QVariant *)pTVar2);
    ::QVariant::~QVariant(&local_48);
    pTVar2 = std::
             unique_ptr<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
             ::operator->((unique_ptr<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
                           *)0x6b6605);
    QVariantAnimation::setDuration((int)pTVar2);
    pTVar2 = std::
             unique_ptr<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
             ::operator->((unique_ptr<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
                           *)0x6b6622);
    QAbstractAnimation::start((DeletionPolicy)pTVar2);
  }
  else {
    QListSpecialMethodsBase<QTabBarPrivate::Tab*>::indexOf<QTabBarPrivate::Tab*>
              ((QListSpecialMethodsBase<QTabBarPrivate::Tab_*> *)in_stack_ffffffffffffff70,
               (Tab **)in_stack_ffffffffffffff68,0x6b6510);
    moveTabFinished(in_RSI,(int)((ulong)in_RDI >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void startAnimation(QTabBarPrivate *priv, int duration) {
            if (!priv->isAnimated()) {
                priv->moveTabFinished(priv->tabList.indexOf(this));
                return;
            }
            if (!animation)
                animation = std::make_unique<TabBarAnimation>(this, priv);
            animation->setStartValue(dragOffset);
            animation->setEndValue(0);
            animation->setDuration(duration);
            animation->start();
        }